

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_vectorization.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  undefined1 auStack_88 [8];
  Vector4d result;
  Vector4d inputs [2];
  
  result.data[3] = 1.0;
  poVar1 = std::operator<<((ostream *)&std::cout,"address of input1: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"address of input2: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  auStack_88 = (undefined1  [8])(result.data[3] + 1.0);
  result.data[0] = 3.0;
  result.data[1] = 4.0;
  result.data[2] = 5.0;
  operator<<((ostream *)&std::cout,(Vector4d *)auStack_88);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return 0;
}

Assistant:

int main() {
  Vector4d inputs[2] =  {{1, 1, 1, 1}, {1, 2, 3, 4}};

  std::cout << "address of input1: " << inputs[0].data << std::endl;
  std::cout << "address of input2: " << inputs[1].data << std::endl;

  Vector4d result = inputs[0] + inputs[1];

  std::cout << result << std::endl;

  return 0;
}